

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

iterator __thiscall
llvm::SmallVectorImpl<std::__cxx11::string>::insert<llvm::StringRef_const*,void>
          (SmallVectorImpl<std::__cxx11::string> *this,iterator I,StringRef *From,StringRef *To)

{
  iterator pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *OldEnd;
  move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  in_end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *J;
  ulong uVar2;
  move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  this_00;
  long lVar3;
  ulong uVar4;
  long lVar5;
  move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  __first;
  bool bVar6;
  string local_50;
  
  pbVar1 = *(iterator *)this;
  lVar5 = (long)I - (long)pbVar1;
  if (pbVar1 + *(uint *)(this + 8) == I) {
    append<llvm::StringRef_const*,void>(this,From,To);
    __first._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (lVar5 + *(long *)this);
  }
  else {
    if (I < pbVar1) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<std::basic_string<char>>::insert(iterator, ItTy, ItTy) [T = std::basic_string<char>, ItTy = const llvm::StringRef *]"
                   );
    }
    if (pbVar1 + *(uint *)(this + 8) < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<std::basic_string<char>>::insert(iterator, ItTy, ItTy) [T = std::basic_string<char>, ItTy = const llvm::StringRef *]"
                   );
    }
    uVar2 = (long)To - (long)From >> 4;
    SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::reserve((SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,*(uint *)(this + 8) + uVar2);
    __first._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (*(long *)this + lVar5);
    lVar3 = (ulong)*(uint *)(this + 8) * 0x20;
    in_end._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (*(long *)this + lVar3);
    uVar4 = lVar3 - lVar5 >> 5;
    if (uVar4 < uVar2) {
      SmallVectorBase::set_size((SmallVectorBase *)this,uVar2 + *(uint *)(this + 8));
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<std::__cxx11::string*>,std::__cxx11::string*>
                (__first,in_end,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)*(uint *)(this + 8) * 0x20 + *(long *)this + uVar4 * -0x20));
      this_00._M_current = __first._M_current;
      while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
        StringRef::str_abi_cxx11_(&local_50,From);
        std::__cxx11::string::operator=((string *)this_00._M_current,(string *)&local_50);
        std::__cxx11::string::_M_dispose();
        this_00._M_current = this_00._M_current + 1;
        From = From + 1;
      }
      std::__uninitialized_copy<false>::__uninit_copy<llvm::StringRef_const*,std::__cxx11::string*>
                (From,To,in_end._M_current);
    }
    else {
      append<std::move_iterator<std::__cxx11::string*>,void>(this,in_end._M_current + -uVar2,in_end)
      ;
      std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
      __copy_move_b<std::__cxx11::string*,std::__cxx11::string*>
                (__first._M_current,in_end._M_current + -uVar2,in_end._M_current);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<llvm::StringRef_const*,std::__cxx11::string*>(From,To,__first._M_current);
    }
  }
  return __first._M_current;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }